

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O1

void * dlmalloc(size_t bytes)

{
  mchunkptr pmVar1;
  mchunkptr pmVar2;
  mstate pmVar3;
  size_t *psVar4;
  byte *pbVar5;
  char *pcVar6;
  tbinptr pmVar7;
  malloc_tree_chunk *pmVar8;
  malloc_tree_chunk *pmVar9;
  malloc_chunk *pmVar10;
  size_t sVar11;
  binmap_t bVar12;
  binmap_t bVar13;
  malloc_chunk *pmVar14;
  size_t dvs;
  char *pcVar15;
  mstate m;
  ulong uVar16;
  mchunkptr pmVar17;
  mchunkptr pmVar18;
  int *piVar19;
  uint uVar20;
  tbinptr pmVar21;
  ulong uVar22;
  malloc_tree_chunk **ppmVar23;
  tbinptr pmVar24;
  long lVar25;
  char *oldbase;
  uint uVar26;
  malloc_segment *pmVar27;
  malloc_chunk *pmVar28;
  mchunkptr pmVar29;
  long *plVar30;
  malloc_tree_chunk *pmVar31;
  malloc_chunk *pmVar32;
  long lVar33;
  byte bVar34;
  ulong uVar35;
  malloc_chunk **ppmVar36;
  tbinptr pmVar37;
  tbinptr unaff_R14;
  char *pcVar38;
  bool bVar39;
  
  sVar11 = _gm_.dvsize;
  bVar13 = _gm_.treemap;
  bVar12 = _gm_.smallmap;
  if (bytes < 0xe9) {
    oldbase = &DAT_00000020;
    if (0x16 < bytes) {
      oldbase = (char *)(ulong)((int)bytes + 0x17U & 0x1f0);
    }
    bVar34 = (byte)((ulong)oldbase >> 3);
    uVar26 = _gm_.smallmap >> (bVar34 & 0x1f);
    if ((uVar26 & 3) != 0) {
      uVar26 = (uVar26 & 1 | (uint)((ulong)oldbase >> 3)) ^ 1;
      uVar22 = (ulong)(uVar26 << 4);
      pcVar15 = (char *)((long)_gm_.smallbins + uVar22);
      lVar33 = *(long *)((long)_gm_.smallbins + uVar22 + 0x10);
      pcVar38 = *(char **)(lVar33 + 0x10);
      if (pcVar15 == pcVar38) {
        _gm_.smallmap = _gm_.smallmap & ~(1 << (uVar26 & 0x1f));
      }
      else {
        if ((pcVar38 < _gm_.least_addr) || (*(long *)(pcVar38 + 0x18) != lVar33)) goto LAB_00104466;
        *(char **)(pcVar38 + 0x18) = pcVar15;
        *(char **)((long)_gm_.smallbins + uVar22 + 0x10) = pcVar38;
      }
      unaff_R14 = (tbinptr)(lVar33 + 0x10);
      *(ulong *)(lVar33 + 8) = (ulong)(uVar26 << 3) + 3;
      pbVar5 = (byte *)(lVar33 + 8 + (ulong)(uVar26 << 3));
      *pbVar5 = *pbVar5 | 1;
      goto LAB_0010376e;
    }
    bVar39 = true;
    if (_gm_.dvsize < oldbase) {
      if (_gm_.smallmap >> (bVar34 & 0x1f) != 0) {
        uVar20 = 2 << (bVar34 & 0x1f);
        uVar20 = (-uVar20 | uVar20) & uVar26 << (bVar34 & 0x1f);
        uVar26 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
          }
        }
        uVar22 = (ulong)(uVar26 << 4);
        pcVar15 = (char *)((long)_gm_.smallbins + uVar22);
        lVar33 = *(long *)((long)_gm_.smallbins + uVar22 + 0x10);
        pcVar38 = *(char **)(lVar33 + 0x10);
        if (pcVar15 == pcVar38) {
          _gm_.smallmap = _gm_.smallmap & ~(1 << (uVar26 & 0x1f));
        }
        else {
          if ((pcVar38 < _gm_.least_addr) || (*(long *)(pcVar38 + 0x18) != lVar33))
          goto LAB_00104466;
          *(char **)(pcVar38 + 0x18) = pcVar15;
          *(char **)((long)_gm_.smallbins + uVar22 + 0x10) = pcVar38;
        }
        unaff_R14 = (tbinptr)(lVar33 + 0x10);
        uVar35 = (ulong)(uVar26 << 3);
        uVar22 = uVar35 - (long)oldbase;
        if (uVar22 < 0x20) {
          *(ulong *)(lVar33 + 8) = uVar35 | 3;
          pbVar5 = (byte *)(lVar33 + 8 + uVar35);
          *pbVar5 = *pbVar5 | 1;
        }
        else {
          *(ulong *)(lVar33 + 8) = (ulong)oldbase | 3;
          *(ulong *)(oldbase + lVar33 + 8) = uVar22 | 1;
          *(ulong *)(lVar33 + uVar35) = uVar22;
          if (sVar11 != 0) {
            uVar26 = (uint)(sVar11 >> 3);
            uVar35 = (ulong)(uVar26 * 2);
            if ((_gm_.smallmap >> (uVar26 & 0x1f) & 1) == 0) {
              _gm_.smallmap = _gm_.smallmap | 1 << ((byte)(sVar11 >> 3) & 0x1f);
              pmVar17 = (mchunkptr)(_gm_.smallbins + uVar35);
            }
            else {
              pmVar17 = _gm_.smallbins[uVar35 + 2];
              if (_gm_.smallbins[uVar35 + 2] < _gm_.least_addr) goto LAB_00104466;
            }
            _gm_.smallbins[uVar35 + 2] = _gm_.dv;
            pmVar17->bk = _gm_.dv;
            (_gm_.dv)->fd = pmVar17;
            (_gm_.dv)->bk = (mchunkptr)(_gm_.smallbins + uVar35);
          }
          _gm_.dv = (mchunkptr)(oldbase + lVar33);
          _gm_.dvsize = uVar22;
        }
        goto LAB_0010376e;
      }
      if (_gm_.treemap != 0) {
        uVar26 = 0;
        if (_gm_.treemap != 0) {
          for (; (_gm_.treemap >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
          }
        }
        pmVar24 = _gm_.treebins[uVar26];
        uVar22 = (pmVar24->head & 0xfffffffffffffff8) - (long)oldbase;
        pmVar21 = pmVar24;
        while( true ) {
          pmVar31 = pmVar24->child[0];
          if (pmVar31 == (malloc_tree_chunk *)0x0) {
            pmVar31 = pmVar24->child[1];
          }
          if (pmVar31 == (malloc_tree_chunk *)0x0) break;
          uVar35 = (pmVar31->head & 0xfffffffffffffff8) - (long)oldbase;
          pmVar24 = pmVar31;
          if (uVar35 < uVar22) {
            uVar22 = uVar35;
            pmVar21 = pmVar31;
          }
        }
        if (pmVar21 < _gm_.least_addr) goto LAB_00104466;
        pmVar31 = pmVar21->bk;
        pmVar8 = pmVar21->parent;
        if (pmVar31 == pmVar21) {
          pmVar31 = pmVar21->child[1];
          if (pmVar31 != (malloc_tree_chunk *)0x0) {
            ppmVar23 = pmVar21->child + 1;
LAB_0010432d:
            do {
              if (pmVar31->child[1] == (malloc_tree_chunk *)0x0) {
                if (pmVar31->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x00104341;
                ppmVar23 = pmVar31->child;
              }
              else {
                ppmVar23 = pmVar31->child + 1;
              }
              pmVar31 = *ppmVar23;
            } while( true );
          }
          pmVar31 = pmVar21->child[0];
          if (pmVar31 != (malloc_tree_chunk *)0x0) {
            ppmVar23 = pmVar21->child;
            goto LAB_0010432d;
          }
          pmVar31 = (malloc_tree_chunk *)0x0;
        }
        else {
          pmVar9 = pmVar21->fd;
          if (((pmVar9 < _gm_.least_addr) || (pmVar9->bk != pmVar21)) || (pmVar31->fd != pmVar21))
          goto LAB_00104466;
          pmVar9->bk = pmVar31;
          pmVar31->fd = pmVar9;
        }
        goto LAB_00104351;
      }
    }
    unaff_R14 = (tbinptr)0x0;
    goto LAB_001038a8;
  }
  oldbase = (char *)0xffffffffffffffff;
  if (bytes < 0xffffffffffffff80) {
    oldbase = (char *)(bytes + 0x17 & 0xfffffffffffffff0);
    if (_gm_.treemap != 0) {
      uVar26 = (uint)(bytes + 0x17 >> 8);
      if (uVar26 == 0) {
        uVar20 = 0;
      }
      else {
        uVar20 = 0x1f;
        if (uVar26 < 0x10000) {
          uVar20 = 0x1f;
          if (uVar26 != 0) {
            for (; uVar26 >> uVar20 == 0; uVar20 = uVar20 - 1) {
            }
          }
          uVar20 = (uint)(((ulong)oldbase >> ((ulong)(byte)(0x26 - (char)(uVar20 ^ 0x1f)) & 0x3f) &
                          1) != 0) + (uVar20 ^ 0x1f) * 2 ^ 0x3e;
        }
      }
      uVar22 = -(long)oldbase;
      pmVar24 = _gm_.treebins[uVar20];
      unaff_R14 = (tbinptr)0x0;
      if (pmVar24 == (tbinptr)0x0) {
        pmVar24 = (tbinptr)0x0;
      }
      else {
        bVar34 = 0x39 - (char)(uVar20 >> 1);
        if (uVar20 == 0x1f) {
          bVar34 = 0;
        }
        lVar33 = (long)oldbase << (bVar34 & 0x3f);
        pmVar21 = (tbinptr)0x0;
        do {
          uVar35 = (pmVar24->head & 0xfffffffffffffff8) - (long)oldbase;
          if ((uVar35 < uVar22) && (uVar22 = uVar35, unaff_R14 = pmVar24, uVar35 == 0)) {
            bVar39 = false;
            uVar22 = 0;
          }
          else {
            pmVar7 = pmVar24->child[1];
            pmVar24 = *(tbinptr *)((long)pmVar24 + (4 - (lVar33 >> 0x3f)) * 8);
            pmVar37 = pmVar7;
            if (pmVar7 == pmVar24) {
              pmVar37 = pmVar21;
            }
            if (pmVar7 != (tbinptr)0x0) {
              pmVar21 = pmVar37;
            }
            if (pmVar24 == (tbinptr)0x0) {
              bVar39 = false;
              pmVar24 = pmVar21;
            }
            else {
              lVar33 = lVar33 * 2;
              bVar39 = true;
            }
          }
        } while (bVar39);
      }
      if (pmVar24 == (tbinptr)0x0 && unaff_R14 == (tbinptr)0x0) {
        uVar26 = 2 << ((byte)uVar20 & 0x1f);
        uVar26 = (-uVar26 | uVar26) & _gm_.treemap;
        if (uVar26 == 0) {
          pmVar24 = (tbinptr)0x0;
        }
        else {
          uVar20 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
            }
          }
          pmVar24 = _gm_.treebins[uVar20];
        }
      }
      while (pmVar21 = pmVar24, pmVar21 != (tbinptr)0x0) {
        uVar16 = (pmVar21->head & 0xfffffffffffffff8) - (long)oldbase;
        uVar35 = uVar16;
        if (uVar22 <= uVar16) {
          uVar35 = uVar22;
        }
        if (uVar22 > uVar16) {
          unaff_R14 = pmVar21;
        }
        uVar22 = uVar35;
        pmVar24 = pmVar21->child[0];
        if (pmVar21->child[0] == (malloc_tree_chunk *)0x0) {
          pmVar24 = pmVar21->child[1];
        }
      }
      if ((unaff_R14 != (tbinptr)0x0) && (uVar22 < _gm_.dvsize - (long)oldbase)) {
        if (unaff_R14 < _gm_.least_addr) goto LAB_00104466;
        if (0 < (long)oldbase) {
          pmVar24 = unaff_R14->bk;
          pmVar31 = unaff_R14->parent;
          if (pmVar24 == unaff_R14) {
            pmVar24 = unaff_R14->child[1];
            if (pmVar24 != (tbinptr)0x0) {
              ppmVar23 = unaff_R14->child + 1;
LAB_00103ed0:
              do {
                if (pmVar24->child[1] == (malloc_tree_chunk *)0x0) {
                  if (pmVar24->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x00103ee4;
                  ppmVar23 = pmVar24->child;
                }
                else {
                  ppmVar23 = pmVar24->child + 1;
                }
                pmVar24 = *ppmVar23;
              } while( true );
            }
            pmVar24 = unaff_R14->child[0];
            if (pmVar24 != (tbinptr)0x0) {
              ppmVar23 = unaff_R14->child;
              goto LAB_00103ed0;
            }
            pmVar24 = (tbinptr)0x0;
          }
          else {
            pmVar8 = unaff_R14->fd;
            if (((pmVar8 < _gm_.least_addr) || (pmVar8->bk != unaff_R14)) ||
               (pmVar24->fd != unaff_R14)) goto LAB_00104466;
            pmVar8->bk = pmVar24;
            pmVar24->fd = pmVar8;
          }
          goto LAB_00103ef4;
        }
        goto LAB_001042f9;
      }
      unaff_R14 = (tbinptr)0x0;
      goto LAB_00104302;
    }
  }
  goto LAB_001038b1;
code_r0x00104341:
  if (ppmVar23 < _gm_.least_addr) goto LAB_00104466;
  *ppmVar23 = (malloc_tree_chunk *)0x0;
LAB_00104351:
  if (pmVar8 != (malloc_tree_chunk *)0x0) {
    uVar26 = pmVar21->index;
    if (pmVar21 == _gm_.treebins[uVar26]) {
      _gm_.treebins[uVar26] = pmVar31;
      if (pmVar31 == (malloc_tree_chunk *)0x0) {
        _gm_.treemap = bVar13 & ~(1 << (uVar26 & 0x1f));
        goto LAB_0010439e;
      }
    }
    else {
      if (pmVar8 < _gm_.least_addr) goto LAB_00104466;
      if (pmVar8->child[0] == pmVar21) {
        pmVar8->child[0] = pmVar31;
      }
      else {
        pmVar8->child[1] = pmVar31;
      }
LAB_0010439e:
      if (pmVar31 == (malloc_tree_chunk *)0x0) goto LAB_001043eb;
    }
    pcVar38 = _gm_.least_addr;
    if (pmVar31 < _gm_.least_addr) goto LAB_00104466;
    pmVar31->parent = pmVar8;
    pmVar8 = pmVar21->child[0];
    if (pmVar8 != (malloc_tree_chunk *)0x0) {
      if (pmVar8 < pcVar38) goto LAB_00104466;
      pmVar31->child[0] = pmVar8;
      pmVar8->parent = pmVar31;
    }
    pmVar8 = pmVar21->child[1];
    if (pmVar8 != (malloc_tree_chunk *)0x0) {
      if (pmVar8 < pcVar38) goto LAB_00104466;
      pmVar31->child[1] = pmVar8;
      pmVar8->parent = pmVar31;
    }
  }
LAB_001043eb:
  if (uVar22 < 0x20) {
    pmVar21->head = (ulong)(oldbase + uVar22) | 3;
    pbVar5 = (byte *)((long)&pmVar21->head + (long)(oldbase + uVar22));
    *pbVar5 = *pbVar5 | 1;
    uVar22 = _gm_.dvsize;
    pmVar17 = _gm_.dv;
  }
  else {
    pmVar17 = (mchunkptr)(oldbase + (long)(pmVar21->child + -4));
    pmVar21->head = (ulong)oldbase | 3;
    *(ulong *)((long)&pmVar21->head + (long)oldbase) = uVar22 | 1;
    *(ulong *)((long)&pmVar17->prev_foot + uVar22) = uVar22;
    if (sVar11 != 0) {
      uVar26 = (uint)(sVar11 >> 3);
      uVar35 = (ulong)(uVar26 * 2);
      if ((bVar12 >> (uVar26 & 0x1f) & 1) == 0) {
        _gm_.smallmap = 1 << ((byte)(sVar11 >> 3) & 0x1f) | bVar12;
        pmVar18 = (mchunkptr)(_gm_.smallbins + uVar35);
      }
      else {
        pmVar18 = _gm_.smallbins[uVar35 + 2];
        if (_gm_.smallbins[uVar35 + 2] < _gm_.least_addr) goto LAB_00104466;
      }
      _gm_.smallbins[uVar35 + 2] = _gm_.dv;
      pmVar18->bk = _gm_.dv;
      (_gm_.dv)->fd = pmVar18;
      (_gm_.dv)->bk = (mchunkptr)(_gm_.smallbins + uVar35);
    }
  }
  _gm_.dv = pmVar17;
  _gm_.dvsize = uVar22;
  unaff_R14 = (tbinptr)&pmVar21->fd;
LAB_0010376e:
  bVar39 = false;
LAB_001038a8:
  if (!bVar39) {
    return unaff_R14;
  }
  goto LAB_001038b1;
code_r0x00103ee4:
  if (ppmVar23 < _gm_.least_addr) goto LAB_00104466;
  *ppmVar23 = (malloc_tree_chunk *)0x0;
LAB_00103ef4:
  if (pmVar31 != (malloc_tree_chunk *)0x0) {
    uVar26 = unaff_R14->index;
    if (unaff_R14 == _gm_.treebins[uVar26]) {
      _gm_.treebins[uVar26] = pmVar24;
      if (pmVar24 == (tbinptr)0x0) {
        _gm_.treemap = bVar13 & ~(1 << (uVar26 & 0x1f));
        goto LAB_00103f42;
      }
    }
    else {
      if (pmVar31 < _gm_.least_addr) goto LAB_00104466;
      if (pmVar31->child[0] == unaff_R14) {
        pmVar31->child[0] = pmVar24;
      }
      else {
        pmVar31->child[1] = pmVar24;
      }
LAB_00103f42:
      if (pmVar24 == (tbinptr)0x0) goto LAB_00103f8f;
    }
    pcVar38 = _gm_.least_addr;
    if (pmVar24 < _gm_.least_addr) goto LAB_00104466;
    pmVar24->parent = pmVar31;
    pmVar31 = unaff_R14->child[0];
    if (pmVar31 != (malloc_tree_chunk *)0x0) {
      if (pmVar31 < pcVar38) goto LAB_00104466;
      pmVar24->child[0] = pmVar31;
      pmVar31->parent = pmVar24;
    }
    pmVar31 = unaff_R14->child[1];
    if (pmVar31 != (malloc_tree_chunk *)0x0) {
      if (pmVar31 < pcVar38) goto LAB_00104466;
      pmVar24->child[1] = pmVar31;
      pmVar31->parent = pmVar24;
    }
  }
LAB_00103f8f:
  if (uVar22 < 0x20) {
    unaff_R14->head = (ulong)(oldbase + uVar22) | 3;
    pbVar5 = (byte *)((long)&unaff_R14->head + (long)(oldbase + uVar22));
    *pbVar5 = *pbVar5 | 1;
  }
  else {
    pmVar32 = (malloc_chunk *)(oldbase + (long)&unaff_R14->prev_foot);
    unaff_R14->head = (ulong)oldbase | 3;
    *(ulong *)((long)&unaff_R14->head + (long)oldbase) = uVar22 | 1;
    *(ulong *)((long)&pmVar32->prev_foot + uVar22) = uVar22;
    if (uVar22 < 0x100) {
      uVar22 = uVar22 >> 3;
      if ((_gm_.smallmap >> ((uint)uVar22 & 0x1f) & 1) == 0) {
        _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar22 & 0x1f);
        pmVar17 = (malloc_chunk *)(_gm_.smallbins + uVar22 * 2);
      }
      else {
        pmVar17 = _gm_.smallbins[uVar22 * 2 + 2];
        if (_gm_.smallbins[uVar22 * 2 + 2] < _gm_.least_addr) goto LAB_00104466;
      }
      _gm_.smallbins[uVar22 * 2 + 2] = pmVar32;
      pmVar17->bk = pmVar32;
      pmVar32->fd = pmVar17;
      pmVar32->bk = (malloc_chunk *)(_gm_.smallbins + uVar22 * 2);
    }
    else {
      uVar26 = (uint)(uVar22 >> 8);
      if (uVar26 == 0) {
        uVar20 = 0;
      }
      else {
        uVar20 = 0x1f;
        if (uVar26 < 0x10000) {
          uVar20 = 0x1f;
          if (uVar26 != 0) {
            for (; uVar26 >> uVar20 == 0; uVar20 = uVar20 - 1) {
            }
          }
          uVar20 = (uint)((uVar22 >> ((ulong)(byte)(0x26 - (char)(uVar20 ^ 0x1f)) & 0x3f) & 1) != 0)
                   + (uVar20 ^ 0x1f) * 2 ^ 0x3e;
        }
      }
      pmVar28 = (malloc_chunk *)(_gm_.treebins + uVar20);
      *(uint *)&pmVar32[1].bk = uVar20;
      pmVar32[1].prev_foot = 0;
      pmVar32[1].head = 0;
      if ((_gm_.treemap >> (uVar20 & 0x1f) & 1) == 0) {
        _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar20 & 0x1f);
        pmVar28->prev_foot = (size_t)pmVar32;
        pmVar32[1].fd = pmVar28;
        pmVar32->bk = pmVar32;
        pmVar32->fd = pmVar32;
      }
      else {
        pmVar28 = (malloc_chunk *)pmVar28->prev_foot;
        bVar34 = 0x39 - (char)(uVar20 >> 1);
        if (uVar20 == 0x1f) {
          bVar34 = 0;
        }
        lVar33 = uVar22 << (bVar34 & 0x3f);
        do {
          if ((pmVar28->head & 0xfffffffffffffff8) == uVar22) {
            if ((pmVar28 < _gm_.least_addr) || (pmVar10 = pmVar28->fd, pmVar10 < _gm_.least_addr))
            goto LAB_00104466;
            pmVar10->bk = pmVar32;
            pmVar28->fd = pmVar32;
            pmVar32->fd = pmVar10;
            pmVar32->bk = pmVar28;
            pmVar32[1].fd = (malloc_chunk *)0x0;
            break;
          }
          pmVar10 = *(malloc_chunk **)((long)pmVar28 + (lVar33 >> 0x3f) * -8 + 0x20);
          pmVar14 = pmVar10;
          if (pmVar10 == (malloc_chunk *)0x0) {
            plVar30 = (long *)((long)pmVar28 + (lVar33 >> 0x3f) * -8 + 0x20);
            if (plVar30 < _gm_.least_addr) goto LAB_00104466;
            *plVar30 = (long)pmVar32;
            pmVar32[1].fd = pmVar28;
            pmVar32->bk = pmVar32;
            pmVar32->fd = pmVar32;
            pmVar14 = pmVar28;
          }
          pmVar28 = pmVar14;
          lVar33 = lVar33 * 2;
        } while (pmVar10 != (malloc_chunk *)0x0);
      }
    }
  }
  unaff_R14 = (tbinptr)&unaff_R14->fd;
LAB_001042f9:
  if ((long)oldbase < 1) goto LAB_00104466;
LAB_00104302:
  if (unaff_R14 != (tbinptr)0x0) {
    return unaff_R14;
  }
LAB_001038b1:
  pmVar17 = _gm_.dv;
  sVar11 = _gm_.dvsize;
  uVar22 = _gm_.dvsize - (long)oldbase;
  if (_gm_.dvsize < oldbase) {
    uVar22 = _gm_.topsize - (long)oldbase;
    if (_gm_.topsize < oldbase || uVar22 == 0) {
      if (mparams.magic == 0) {
        init_mparams();
      }
      if (((((byte)_gm_.mflags & 1) != 0) && (mparams.mmap_threshold <= oldbase)) &&
         (_gm_.topsize != 0)) {
        pcVar38 = (char *)(-mparams.page_size & (ulong)(oldbase + mparams.page_size + 0x3e));
        if (((_gm_.footprint_limit == 0) ||
            (pcVar38 + _gm_.footprint <= _gm_.footprint_limit &&
             _gm_.footprint < pcVar38 + _gm_.footprint)) && (oldbase < pcVar38)) {
          unaff_R14 = (tbinptr)0x0;
          pcVar15 = (char *)mmap((void *)0x0,(size_t)pcVar38,3,0x22,-1,0);
          if (pcVar15 != (char *)0xffffffffffffffff) {
            uVar22 = (ulong)(-(int)pcVar15 - 0x10U & 0xf);
            *(ulong *)(pcVar15 + uVar22) = uVar22;
            *(char **)(pcVar15 + uVar22 + 8) = pcVar38 + (-0x20 - uVar22);
            pcVar6 = pcVar15 + (long)(pcVar38 + -0x18);
            pcVar6[0] = '\v';
            pcVar6[1] = '\0';
            pcVar6[2] = '\0';
            pcVar6[3] = '\0';
            pcVar6[4] = '\0';
            pcVar6[5] = '\0';
            pcVar6[6] = '\0';
            pcVar6[7] = '\0';
            pcVar6 = pcVar15 + -0x10 + (long)pcVar38;
            pcVar6[0] = '\0';
            pcVar6[1] = '\0';
            pcVar6[2] = '\0';
            pcVar6[3] = '\0';
            pcVar6[4] = '\0';
            pcVar6[5] = '\0';
            pcVar6[6] = '\0';
            pcVar6[7] = '\0';
            if ((_gm_.least_addr == (char *)0x0) || (pcVar15 < _gm_.least_addr)) {
              _gm_.least_addr = pcVar15;
            }
            _gm_.footprint = (size_t)(pcVar38 + _gm_.footprint);
            if (_gm_.max_footprint < _gm_.footprint) {
              _gm_.max_footprint = _gm_.footprint;
            }
            unaff_R14 = (tbinptr)(pcVar15 + uVar22 + 0x10);
          }
          if (pcVar15 == (char *)0xffffffffffffffff) goto LAB_00103a49;
        }
        else {
LAB_00103a49:
          unaff_R14 = (tbinptr)0x0;
        }
        if (unaff_R14 != (tbinptr)0x0) {
          return unaff_R14;
        }
      }
      pcVar38 = (char *)(-mparams.granularity & (ulong)(oldbase + mparams.granularity + 0x5f));
      if (pcVar38 <= oldbase) {
        return (void *)0x0;
      }
      if ((_gm_.footprint_limit != 0) &&
         (_gm_.footprint_limit < pcVar38 + _gm_.footprint ||
          pcVar38 + _gm_.footprint <= _gm_.footprint)) {
        return (void *)0x0;
      }
      m = (mstate)mmap((void *)0x0,(size_t)pcVar38,3,0x22,-1,0);
      pmVar17 = _gm_.top;
      bVar39 = m != (mstate)0xffffffffffffffff;
      if (!bVar39) {
LAB_0010462b:
        piVar19 = __errno_location();
        *piVar19 = 0xc;
        return (void *)0x0;
      }
      _gm_.footprint = (size_t)(pcVar38 + _gm_.footprint);
      if (_gm_.max_footprint < _gm_.footprint) {
        _gm_.max_footprint = _gm_.footprint;
      }
      if (_gm_.top == (mchunkptr)0x0) {
        if ((_gm_.least_addr == (char *)0x0) || (m < _gm_.least_addr)) {
          _gm_.least_addr = (char *)m;
        }
        _gm_.magic = mparams.magic;
        _gm_.release_checks = 0xfff;
        lVar33 = 0x20;
        lVar25 = 0x10c198;
        _gm_.seg.base = (char *)m;
        _gm_.seg.size = (size_t)pcVar38;
        _gm_.seg.sflags = (uint)bVar39;
        do {
          *(long *)(lVar25 + 0x18) = lVar25;
          *(long *)(lVar25 + 0x10) = lVar25;
          lVar25 = lVar25 + 0x10;
          lVar33 = lVar33 + -1;
        } while (lVar33 != 0);
        uVar22 = (ulong)(-(int)m - 0x10U & 0xf);
        _gm_.top = (mchunkptr)((long)m->smallbins + (uVar22 - 0x48));
        _gm_.topsize = (size_t)(pcVar38 + (-0x50 - uVar22));
        *(size_t *)((long)m->smallbins + (uVar22 - 0x40)) = _gm_.topsize | 1;
        pcVar38 = (char *)((long)&m[-1].max_footprint + (long)pcVar38);
        pcVar38[0] = 'P';
        pcVar38[1] = '\0';
        pcVar38[2] = '\0';
        pcVar38[3] = '\0';
        pcVar38[4] = '\0';
        pcVar38[5] = '\0';
        pcVar38[6] = '\0';
        pcVar38[7] = '\0';
        _gm_.trim_check = mparams.trim_threshold;
      }
      else {
        pmVar27 = &_gm_.seg;
        do {
          pmVar3 = (mstate)((long)&((mchunkptr)pmVar27->base)->prev_foot + pmVar27->size);
          if (m == pmVar3) {
            if ((((_gm_.top < pmVar3) && ((mchunkptr)pmVar27->base <= _gm_.top)) &&
                ((pmVar27->sflags & 8) == 0)) && ((pmVar27->sflags & 1) != 0)) {
              pmVar27->size = (size_t)(pcVar38 + pmVar27->size);
              pcVar38 = pcVar38 + _gm_.topsize;
              uVar22 = (ulong)(-(int)_gm_.top - 0x10U & 0xf);
              _gm_.topsize = (long)pcVar38 - uVar22;
              psVar4 = &(_gm_.top)->head;
              _gm_.top = (mchunkptr)((long)&(_gm_.top)->prev_foot + uVar22);
              *(size_t *)((long)psVar4 + uVar22) = _gm_.topsize | 1;
              pcVar38 = (char *)((long)&pmVar17->head + (long)pcVar38);
              pcVar38[0] = 'P';
              pcVar38[1] = '\0';
              pcVar38[2] = '\0';
              pcVar38[3] = '\0';
              pcVar38[4] = '\0';
              pcVar38[5] = '\0';
              pcVar38[6] = '\0';
              pcVar38[7] = '\0';
              _gm_.trim_check = mparams.trim_threshold;
              bVar39 = true;
              goto LAB_00104612;
            }
            break;
          }
          pmVar27 = pmVar27->next;
        } while (pmVar27 != (malloc_segment *)0x0);
        if (m < _gm_.least_addr) {
          _gm_.least_addr = (char *)m;
        }
        pmVar27 = &_gm_.seg;
        do {
          pcVar15 = pmVar27->base;
          if (pcVar15 == pcVar38 + (long)(m->smallbins + -9)) {
            if (((pmVar27->sflags & 8) == 0 & (byte)pmVar27->sflags) != 0) {
              pmVar27->base = (char *)m;
              pmVar27->size = (size_t)(pcVar38 + pmVar27->size);
              unaff_R14 = (tbinptr)prepend_alloc(m,pcVar15,oldbase,(ulong)bVar39);
              bVar39 = false;
              goto LAB_00104612;
            }
            break;
          }
          pmVar27 = pmVar27->next;
        } while (pmVar27 != (malloc_segment *)0x0);
        for (pmVar27 = &_gm_.seg;
            (_gm_.top < (mchunkptr)pmVar27->base ||
            (pmVar18 = (mchunkptr)((long)&((mchunkptr)pmVar27->base)->prev_foot + pmVar27->size),
            pmVar18 <= _gm_.top)); pmVar27 = pmVar27->next) {
        }
        pmVar29 = (mchunkptr)((long)pmVar18 + ((ulong)(0x4fU - (int)pmVar18 & 0xf) - 0x5f));
        pmVar1 = _gm_.top + 1;
        if (pmVar29 < pmVar1) {
          pmVar29 = _gm_.top;
        }
        uVar22 = (ulong)(-(int)m - 0x10U & 0xf);
        _gm_.top = (mchunkptr)((long)m->smallbins + (uVar22 - 0x48));
        _gm_.topsize = (size_t)(pcVar38 + (-0x50 - uVar22));
        *(size_t *)((long)m->smallbins + (uVar22 - 0x40)) = _gm_.topsize | 1;
        pcVar15 = (char *)((long)&m[-1].max_footprint + (long)pcVar38);
        pcVar15[0] = 'P';
        pcVar15[1] = '\0';
        pcVar15[2] = '\0';
        pcVar15[3] = '\0';
        pcVar15[4] = '\0';
        pcVar15[5] = '\0';
        pcVar15[6] = '\0';
        pcVar15[7] = '\0';
        _gm_.trim_check = mparams.trim_threshold;
        pmVar29->head = 0x33;
        sVar11 = CONCAT44(_gm_.seg._28_4_,_gm_.seg.sflags);
        pmVar29[1].prev_foot = (size_t)_gm_.seg.next;
        pmVar29[1].head = sVar11;
        pmVar29->fd = (malloc_chunk *)_gm_.seg.base;
        pmVar29->bk = (malloc_chunk *)_gm_.seg.size;
        ppmVar36 = &pmVar29[1].fd;
        _gm_.seg.base = (char *)m;
        _gm_.seg.size = (size_t)pcVar38;
        _gm_.seg.next = (malloc_segment *)&pmVar29->fd;
        _gm_.seg.sflags = (uint)bVar39;
        do {
          ppmVar36[1] = (malloc_chunk *)0xb;
          pmVar2 = (mchunkptr)(ppmVar36 + 2);
          ppmVar36 = ppmVar36 + 1;
        } while (pmVar2 < pmVar18);
        bVar39 = true;
        uVar22 = (long)pmVar29 - (long)pmVar17;
        if (uVar22 != 0) {
          *(byte *)&pmVar29->head = (byte)pmVar29->head & 0xfe;
          pmVar17->head = uVar22 | 1;
          pmVar29->prev_foot = uVar22;
          if (uVar22 < 0x100) {
            uVar22 = uVar22 >> 3;
            if ((_gm_.smallmap >> ((uint)uVar22 & 0x1f) & 1) == 0) {
              _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar22 & 0x1f);
              pmVar18 = (mchunkptr)(_gm_.smallbins + uVar22 * 2);
            }
            else {
              pmVar18 = _gm_.smallbins[uVar22 * 2 + 2];
              if (_gm_.smallbins[uVar22 * 2 + 2] < _gm_.least_addr) {
LAB_00104466:
                abort();
              }
            }
            _gm_.smallbins[uVar22 * 2 + 2] = pmVar17;
            pmVar18->bk = pmVar17;
            pmVar17->fd = pmVar18;
            pmVar17->bk = (mchunkptr)(_gm_.smallbins + uVar22 * 2);
          }
          else {
            uVar26 = (uint)(uVar22 >> 8);
            if (uVar26 == 0) {
              uVar20 = 0;
            }
            else {
              uVar20 = 0x1f;
              if (uVar26 < 0x10000) {
                uVar20 = 0x1f;
                if (uVar26 != 0) {
                  for (; uVar26 >> uVar20 == 0; uVar20 = uVar20 - 1) {
                  }
                }
                uVar20 = (uint)((uVar22 >> ((ulong)(byte)(0x26 - (char)(uVar20 ^ 0x1f)) & 0x3f) & 1)
                               != 0) + (uVar20 ^ 0x1f) * 2 ^ 0x3e;
              }
            }
            pmVar32 = (malloc_chunk *)(_gm_.treebins + uVar20);
            *(uint *)&pmVar17[1].bk = uVar20;
            pmVar1->prev_foot = 0;
            pmVar17[1].head = 0;
            if ((_gm_.treemap >> (uVar20 & 0x1f) & 1) == 0) {
              _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar20 & 0x1f);
              pmVar32->prev_foot = (size_t)pmVar17;
              pmVar17[1].fd = pmVar32;
              pmVar17->bk = pmVar17;
              pmVar17->fd = pmVar17;
            }
            else {
              pmVar24 = (tbinptr)pmVar32->prev_foot;
              bVar34 = 0x39 - (char)(uVar20 >> 1);
              if (uVar20 == 0x1f) {
                bVar34 = 0;
              }
              lVar33 = uVar22 << (bVar34 & 0x3f);
              do {
                if ((pmVar24->head & 0xfffffffffffffff8) == uVar22) {
                  if ((pmVar24 < _gm_.least_addr) ||
                     (pmVar31 = pmVar24->fd, pmVar31 < _gm_.least_addr)) goto LAB_00104466;
                  pmVar31->bk = (malloc_tree_chunk *)pmVar17;
                  pmVar24->fd = (malloc_tree_chunk *)pmVar17;
                  pmVar17->fd = (malloc_chunk *)pmVar31;
                  pmVar17->bk = (malloc_chunk *)pmVar24;
                  pmVar17[1].fd = (malloc_chunk *)0x0;
                  break;
                }
                pmVar21 = *(tbinptr *)((long)pmVar24 + (lVar33 >> 0x3f) * -8 + 0x20);
                pmVar7 = pmVar21;
                if (pmVar21 == (tbinptr)0x0) {
                  pcVar38 = (char *)((long)pmVar24 + (lVar33 >> 0x3f) * -8 + 0x20);
                  if (pcVar38 < _gm_.least_addr) goto LAB_00104466;
                  *(mchunkptr *)pcVar38 = pmVar17;
                  pmVar17[1].fd = (malloc_chunk *)pmVar24;
                  pmVar17->bk = pmVar17;
                  pmVar17->fd = pmVar17;
                  pmVar7 = pmVar24;
                }
                pmVar24 = pmVar7;
                lVar33 = lVar33 * 2;
              } while (pmVar21 != (tbinptr)0x0);
            }
          }
        }
LAB_00104612:
        if (!bVar39) {
          return unaff_R14;
        }
      }
      uVar22 = _gm_.topsize - (long)oldbase;
      if (_gm_.topsize < oldbase || uVar22 == 0) goto LAB_0010462b;
    }
    pmVar17 = _gm_.top;
    psVar4 = &(_gm_.top)->head;
    _gm_.topsize = uVar22;
    _gm_.top = (mchunkptr)(oldbase + (long)&(_gm_.top)->prev_foot);
    *(ulong *)((long)psVar4 + (long)oldbase) = uVar22 | 1;
  }
  else {
    if (uVar22 < 0x20) {
      _gm_.dvsize = 0;
      _gm_.dv = (mchunkptr)0x0;
      pmVar17->head = sVar11 | 3;
      pbVar5 = (byte *)((long)&pmVar17->head + sVar11);
      *pbVar5 = *pbVar5 | 1;
      goto LAB_00103b56;
    }
    psVar4 = &(_gm_.dv)->head;
    _gm_.dvsize = uVar22;
    _gm_.dv = (mchunkptr)(oldbase + (long)&(_gm_.dv)->prev_foot);
    *(ulong *)((long)psVar4 + (long)oldbase) = uVar22 | 1;
    *(ulong *)((long)&pmVar17->prev_foot + sVar11) = uVar22;
  }
  pmVar17->head = (ulong)oldbase | 3;
LAB_00103b56:
  return &pmVar17->fd;
}

Assistant:

void* dlmalloc(size_t bytes) {
  /*
     Basic algorithm:
     If a small request (< 256 bytes minus per-chunk overhead):
       1. If one exists, use a remainderless chunk in associated smallbin.
          (Remainderless means that there are too few excess bytes to
          represent as a chunk.)
       2. If it is big enough, use the dv chunk, which is normally the
          chunk adjacent to the one used for the most recent small request.
       3. If one exists, split the smallest available chunk in a bin,
          saving remainder in dv.
       4. If it is big enough, use the top chunk.
       5. If available, get memory from system and use it
     Otherwise, for a large request:
       1. Find the smallest available binned chunk that fits, and use it
          if it is better fitting than dv chunk, splitting if necessary.
       2. If better fitting than any binned chunk, use the dv chunk.
       3. If it is big enough, use the top chunk.
       4. If request size >= mmap threshold, try to directly mmap this chunk.
       5. If available, get memory from system and use it

     The ugly goto's here ensure that postaction occurs along all paths.
  */

#if USE_LOCKS
  ensure_initialization(); /* initialize in sys_alloc if not using locks */
#endif

  if (!PREACTION(gm)) {
    void* mem;
    size_t nb;
    if (bytes <= MAX_SMALL_REQUEST) {
      bindex_t idx;
      binmap_t smallbits;
      nb = (bytes < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(bytes);
      idx = small_index(nb);
      smallbits = gm->smallmap >> idx;

      if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
        mchunkptr b, p;
        idx += ~smallbits & 1;       /* Uses next bin if idx empty */
        b = smallbin_at(gm, idx);
        p = b->fd;
        assert(chunksize(p) == small_index2size(idx));
        unlink_first_small_chunk(gm, b, p, idx);
        set_inuse_and_pinuse(gm, p, small_index2size(idx));
        mem = chunk2mem(p);
        check_malloced_chunk(gm, mem, nb);
        goto postaction;
      }

      else if (nb > gm->dvsize) {
        if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
          mchunkptr b, p, r;
          size_t rsize;
          bindex_t i;
          binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
          binmap_t leastbit = least_bit(leftbits);
          compute_bit2idx(leastbit, i);
          b = smallbin_at(gm, i);
          p = b->fd;
          assert(chunksize(p) == small_index2size(i));
          unlink_first_small_chunk(gm, b, p, i);
          rsize = small_index2size(i) - nb;
          /* Fit here cannot be remainderless if 4byte sizes */
          if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE)
            set_inuse_and_pinuse(gm, p, small_index2size(i));
          else {
            set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
            r = chunk_plus_offset(p, nb);
            set_size_and_pinuse_of_free_chunk(r, rsize);
            replace_dv(gm, r, rsize);
          }
          mem = chunk2mem(p);
          check_malloced_chunk(gm, mem, nb);
          goto postaction;
        }

        else if (gm->treemap != 0 && (mem = tmalloc_small(gm, nb)) != 0) {
          check_malloced_chunk(gm, mem, nb);
          goto postaction;
        }
      }
    }
    else if (bytes >= MAX_REQUEST)
      nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
    else {
      nb = pad_request(bytes);
      if (gm->treemap != 0 && (mem = tmalloc_large(gm, nb)) != 0) {
        check_malloced_chunk(gm, mem, nb);
        goto postaction;
      }
    }

    if (nb <= gm->dvsize) {
      size_t rsize = gm->dvsize - nb;
      mchunkptr p = gm->dv;
      if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
        mchunkptr r = gm->dv = chunk_plus_offset(p, nb);
        gm->dvsize = rsize;
        set_size_and_pinuse_of_free_chunk(r, rsize);
        set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
      }
      else { /* exhaust dv */
        size_t dvs = gm->dvsize;
        gm->dvsize = 0;
        gm->dv = 0;
        set_inuse_and_pinuse(gm, p, dvs);
      }
      mem = chunk2mem(p);
      check_malloced_chunk(gm, mem, nb);
      goto postaction;
    }

    else if (nb < gm->topsize) { /* Split top */
      size_t rsize = gm->topsize -= nb;
      mchunkptr p = gm->top;
      mchunkptr r = gm->top = chunk_plus_offset(p, nb);
      r->head = rsize | PINUSE_BIT;
      set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
      mem = chunk2mem(p);
      check_top_chunk(gm, gm->top);
      check_malloced_chunk(gm, mem, nb);
      goto postaction;
    }

    mem = sys_alloc(gm, nb);

  postaction:
    POSTACTION(gm);
    return mem;
  }

  return 0;
}